

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_ubjson.hpp
# Opt level: O3

type jsoncons::ubjson::
     encode_ubjson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
               (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j,ostream *os,
               ubjson_encode_options *options)

{
  uint8_t *puVar1;
  uint8_t *__s;
  value_type_conflict *__val;
  json_visitor_adaptor<jsoncons::basic_json_visitor<char>,_jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>,_void>
  adaptor;
  ubjson_stream_encoder encoder;
  binary_stream_sink local_e8;
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> local_b0;
  
  local_e8.stream_ptr_ = os;
  __s = (uint8_t *)operator_new(0x4000);
  puVar1 = __s + 0x4000;
  memset(__s,0,0x4000);
  local_b0.super_basic_json_visitor<char>._vptr_basic_json_visitor =
       (_func_int **)&PTR__basic_ubjson_encoder_00b4ba88;
  local_e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.options_._16_4_ =
       *(undefined4 *)(&options->field_0x8 + (long)options->_vptr_ubjson_encode_options[-3]);
  local_b0.options_._vptr_ubjson_encode_options =
       (_func_int **)(ubjson_encode_options::vtable + 0x18);
  local_b0.options_._8_8_ = 0xb4b790;
  local_b0.stack_.
  super__Vector_base<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_b0._116_8_ = 0;
  local_b0.stack_.
  super__Vector_base<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.stack_.
  super__Vector_base<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_b0.stack_.
  super__Vector_base<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::ubjson::basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::stack_item>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_e8.begin_buffer_ = __s;
  local_e8.end_buffer_ = puVar1;
  local_e8.p_ = __s;
  local_b0.sink_.stream_ptr_ = os;
  local_b0.sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  local_b0.sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1;
  local_b0.sink_.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1;
  local_b0.sink_.begin_buffer_ = __s;
  local_b0.sink_.end_buffer_ = puVar1;
  local_b0.sink_.p_ = __s;
  binary_stream_sink::~binary_stream_sink(&local_e8);
  local_e8.stream_ptr_ =
       (basic_ostream<char,_std::char_traits<char>_> *)&PTR__basic_json_visitor_00b4bbb0;
  local_e8.buffer_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&local_b0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
            (j,(basic_json_visitor<char> *)&local_e8);
  basic_ubjson_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::~basic_ubjson_encoder
            (&local_b0);
  return;
}

Assistant:

typename std::enable_if<ext_traits::is_basic_json<T>::value,void>::type 
    encode_ubjson(const T& j, 
                  std::ostream& os, 
                  const ubjson_encode_options& options = ubjson_encode_options())
    {
        using char_type = typename T::char_type;
        ubjson_stream_encoder encoder(os, options);
        auto adaptor = make_json_visitor_adaptor<basic_json_visitor<char_type>>(encoder);
        j.dump(adaptor);
    }